

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

void * run(void *args_abs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  wasm_valtype_t *pwVar3;
  wasm_functype_t *pwVar4;
  undefined8 uVar5;
  long lVar6;
  wasm_func_t *run_func;
  wasm_extern_vec_t exports;
  wasm_instance_t *instance;
  wasm_extern_t *imports [2];
  wasm_global_t *global;
  wasm_globaltype_t *global_type;
  wasm_val_t val;
  wasm_func_t *func;
  wasm_functype_t *func_type;
  int i;
  wasm_module_t *module;
  wasm_store_t *store;
  thread_args *args;
  void *args_abs_local;
  
  uVar1 = wasm_store_new(*args_abs);
  uVar2 = wasm_module_obtain(uVar1,*(undefined8 *)((long)args_abs + 8));
  func_type._4_4_ = 0;
  while( true ) {
    if (2 < func_type._4_4_) {
      wasm_module_delete(uVar2);
      wasm_store_delete(uVar1);
      free(args_abs);
      return (void *)0x0;
    }
    usleep(100000);
    pwVar3 = wasm_valtype_new_i32();
    pwVar4 = wasm_functype_new_1_0(pwVar3);
    val.of.i64 = wasm_func_new(uVar1,pwVar4,callback);
    wasm_functype_delete(pwVar4);
    global_type._0_1_ = 0;
    val._0_4_ = *(undefined4 *)((long)args_abs + 0x10);
    pwVar3 = wasm_valtype_new_i32();
    uVar5 = wasm_globaltype_new(pwVar3,0);
    imports[1] = (wasm_extern_t *)wasm_global_new(uVar1,uVar5,&global_type);
    wasm_globaltype_delete(uVar5);
    instance = (wasm_instance_t *)wasm_func_as_extern(val.of.i64);
    imports[0] = (wasm_extern_t *)wasm_global_as_extern(imports[1]);
    exports.data = (wasm_extern_t **)wasm_instance_new(uVar1,uVar2,&instance,0);
    if (exports.data == (wasm_extern_t **)0x0) {
      printf("> Error instantiating module!\n");
      return (void *)0x0;
    }
    wasm_func_delete(val.of.i64);
    wasm_global_delete(imports[1]);
    wasm_instance_exports(exports.data,&run_func);
    if (run_func == (wasm_func_t *)0x0) {
      printf("> Error accessing exports!\n");
      return (void *)0x0;
    }
    lVar6 = wasm_extern_as_func(*(undefined8 *)exports.size);
    if (lVar6 == 0) break;
    wasm_instance_delete(exports.data);
    lVar6 = wasm_func_call(lVar6,0);
    if (lVar6 != 0) {
      printf("> Error calling function!\n");
      return (void *)0x0;
    }
    wasm_extern_vec_delete(&run_func);
    func_type._4_4_ = func_type._4_4_ + 1;
  }
  printf("> Error accessing export!\n");
  return (void *)0x0;
}

Assistant:

void* run(void* args_abs) {
  thread_args* args = (thread_args*)args_abs;

  // Rereate store and module.
  own wasm_store_t* store = wasm_store_new(args->engine);
  own wasm_module_t* module = wasm_module_obtain(store, args->module);

  // Run the example N times.
  for (int i = 0; i < N_REPS; ++i) {
    usleep(100000);

    // Create imports.
    own wasm_functype_t* func_type = wasm_functype_new_1_0(wasm_valtype_new_i32());
    own wasm_func_t* func = wasm_func_new(store, func_type, callback);
    wasm_functype_delete(func_type);

    wasm_val_t val = {.kind = WASM_I32, .of = {.i32 = (int32_t)args->id}};
    own wasm_globaltype_t* global_type =
      wasm_globaltype_new(wasm_valtype_new_i32(), WASM_CONST);
    own wasm_global_t* global = wasm_global_new(store, global_type, &val);
    wasm_globaltype_delete(global_type);

    // Instantiate.
    const wasm_extern_t* imports[] = {
      wasm_func_as_extern(func), wasm_global_as_extern(global),
    };
    own wasm_instance_t* instance =
      wasm_instance_new(store, module, imports, NULL);
    if (!instance) {
      printf("> Error instantiating module!\n");
      return NULL;
    }

    wasm_func_delete(func);
    wasm_global_delete(global);

    // Extract export.
    own wasm_extern_vec_t exports;
    wasm_instance_exports(instance, &exports);
    if (exports.size == 0) {
      printf("> Error accessing exports!\n");
      return NULL;
    }
    const wasm_func_t *run_func = wasm_extern_as_func(exports.data[0]);
    if (run_func == NULL) {
      printf("> Error accessing export!\n");
      return NULL;
    }

    wasm_instance_delete(instance);

    // Call.
    if (wasm_func_call(run_func, NULL, NULL)) {
      printf("> Error calling function!\n");
      return NULL;
    }

    wasm_extern_vec_delete(&exports);
  }

  wasm_module_delete(module);
  wasm_store_delete(store);

  free(args_abs);

  return NULL;
}